

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

int doctest::detail::suiteOrderComparator(void *a,void *b)

{
  int res;
  TestData *rhs;
  TestData *lhs;
  void *b_local;
  void *a_local;
  
  a_local._4_4_ = strcmp((char *)**a,(char *)**b);
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = fileOrderComparator(a,b);
  }
  return a_local._4_4_;
}

Assistant:

int suiteOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);

        int res = strcmp(lhs->m_suite, rhs->m_suite);
        if(res != 0)
            return res;
        return fileOrderComparator(a, b);
    }